

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Boolean MA_get_pointer(Integer memhandle,void *pointer)

{
  AD *in_RAX;
  Boolean BVar1;
  AD *ad;
  AD *local_18;
  
  ma_stats.calls[9] = ma_stats.calls[9] + 1;
  local_18 = in_RAX;
  BVar1 = mh2ad(memhandle,&local_18,BL_HeapOrStack,"MA_get_pointer");
  if (BVar1 != 0) {
    *(Pointer *)pointer = local_18->client_space;
  }
  return (ulong)(BVar1 != 0);
}

Assistant:

public Boolean MA_get_pointer(
    Integer    memhandle,    /* block to get pointer for */
    void    *pointer     /* RETURN: base pointer */)
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_get_pointer]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (mh2ad(memhandle, &ad, BL_HeapOrStack, "MA_get_pointer"))
    {
        /* compute pointer */
#if 0
        *pointer = ad->client_space;
#endif
        *(char**)pointer = ad->client_space;

        /* success */
        return MA_TRUE;
    }
    else
    {
        /* failure */
        return MA_FALSE;
    }
}